

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *p)

{
  undefined1 *puVar1;
  Printer *pPVar2;
  Options *in_RCX;
  long lVar3;
  anon_class_16_2_fd512ddd emit_field_dtors;
  anon_class_1_0_00000001 local_481;
  long *local_480 [2];
  long local_470 [2];
  undefined1 local_460 [40];
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  undefined1 *local_420;
  undefined8 local_418;
  undefined1 local_410 [16];
  undefined1 *local_400;
  undefined8 local_3f8;
  undefined1 local_3f0;
  undefined7 uStack_3ef;
  undefined8 uStack_3e8;
  Printer *local_3e0;
  MessageGenerator *local_3d8;
  Printer **local_3d0;
  string local_3c8;
  MessageGenerator **local_3a8;
  undefined8 local_3a0;
  code *local_398;
  code *local_390;
  undefined1 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  long *local_258;
  undefined8 local_250;
  long local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  Printer **local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_3e0 = p;
  SimpleBaseClass_abi_cxx11_
            (&local_3c8,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = local_3e0;
  if (local_3c8._M_string_length == 0) {
    local_3d0 = &local_3e0;
    local_460._32_8_ = &local_430;
    local_3d8 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_460 + 0x20),"field_dtors","");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._32_8_ == &local_430) {
      local_3c8.field_2._8_8_ = local_430._8_8_;
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    }
    else {
      local_3c8._M_dataplus._M_p = (pointer)local_460._32_8_;
    }
    local_3c8._M_string_length = local_438;
    local_438 = 0;
    local_430._M_local_buf[0] = '\0';
    local_3a0 = 0;
    local_390 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_398 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_388 = 1;
    local_380 = local_370;
    local_378 = 0;
    local_370[0] = 0;
    local_360 = 0;
    local_460._32_8_ = &local_430;
    local_3a8 = &local_3d8;
    std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x361ff2);
    local_318 = 0;
    puVar1 = local_460 + 0x10;
    local_460._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"split_field_dtors","");
    local_310 = local_300;
    if ((undefined1 *)local_460._0_8_ == puVar1) {
      uStack_2f8 = local_460._24_8_;
    }
    else {
      local_310 = (undefined1 *)local_460._0_8_;
    }
    local_308 = local_460._8_8_;
    local_460._8_8_ = 0;
    local_460[0x10] = 0;
    local_460._0_8_ = puVar1;
    local_2f0 = (undefined8 *)operator_new(0x20);
    *local_2f0 = this;
    local_2f0[1] = &local_3e0;
    local_2f0[2] = &local_3d8;
    *(undefined1 *)(local_2f0 + 3) = 0;
    local_2d8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_2e8 = 0;
    local_2e0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_2d0 = 1;
    local_2c8 = local_2b8;
    local_2c0 = 0;
    local_2b8[0] = 0;
    local_2a8 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x361ff2);
    local_260 = 0;
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"oneof_field_dtors","");
    local_258 = &local_248;
    if (local_480[0] == local_470) {
      uStack_240 = local_470[1];
    }
    else {
      local_258 = local_480[0];
    }
    local_250 = local_480[1];
    local_480[1] = (long *)0x0;
    local_470[0]._0_1_ = 0;
    local_480[0] = local_470;
    local_238 = (undefined8 *)operator_new(0x18);
    *local_238 = this;
    local_238[1] = &local_3e0;
    *(undefined1 *)(local_238 + 2) = 0;
    local_220 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_230 = 0;
    local_228 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_218 = 1;
    local_210 = local_200;
    local_208 = 0;
    local_200[0] = 0;
    local_1f0 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x361ff2);
    local_1a8 = 0;
    local_400 = &local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"weak_fields_dtor","");
    local_1a0 = local_190;
    if (local_400 == &local_3f0) {
      uStack_188 = uStack_3e8;
    }
    else {
      local_1a0 = local_400;
    }
    local_198 = local_3f8;
    local_3f8 = 0;
    local_3f0 = 0;
    local_400 = &local_3f0;
    local_180 = (undefined8 *)operator_new(0x18);
    *local_180 = this;
    local_180[1] = &local_3e0;
    *(undefined1 *)(local_180 + 2) = 0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_178 = 0;
    local_170 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_160 = 1;
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    local_138 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x361ff2);
    local_f0 = 0;
    local_420 = local_410;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"impl_dtor","");
    local_e8 = local_d8;
    if (local_420 == local_410) {
      uStack_d0 = local_410._8_8_;
    }
    else {
      local_e8 = local_420;
    }
    local_e0 = local_418;
    local_418 = 0;
    local_410[0] = 0;
    local_c0 = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    local_420 = local_410;
    local_c8 = &local_3e0;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x361ff2);
    local_38 = 0;
    google::protobuf::io::Printer::Emit
              (pPVar2,&local_3c8,5,0x1b5,
               "\n        inline void $classname$::SharedDtor(MessageLite& self) {\n          $classname$& this_ = static_cast<$classname$&>(self);\n          this_._internal_metadata_.Delete<$unknown_fields_type$>();\n          $DCHK$(this_.GetArena() == nullptr);\n          $WeakDescriptorSelfPin$;\n          $field_dtors$;\n          $split_field_dtors$;\n          $oneof_field_dtors$;\n          $weak_fields_dtor$;\n          $impl_dtor$;\n        }\n      "
              );
    lVar3 = 0x398;
    do {
      if (*(char *)((long)&local_3d0 + lVar3) == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_410 + lVar3));
      }
      if ((long *)(local_430._M_local_buf + lVar3 + 8) != *(long **)((long)&local_438 + lVar3)) {
        operator_delete(*(long **)((long)&local_438 + lVar3),
                        *(long *)(local_430._M_local_buf + lVar3 + 8) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_460[lVar3 + 0x20]]._M_data)
                (&local_481,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_460 + lVar3));
      local_460[lVar3 + 0x20] = 0xff;
      if ((long *)((long)local_470 + lVar3) != *(long **)((long)local_480 + lVar3)) {
        operator_delete(*(long **)((long)local_480 + lVar3),*(long *)((long)local_470 + lVar3) + 1);
      }
      lVar3 = lVar3 + -0xb8;
    } while (lVar3 != 0);
    if (local_420 != local_410) {
      operator_delete(local_420,CONCAT71(local_410._1_7_,local_410[0]) + 1);
    }
    if (local_400 != &local_3f0) {
      operator_delete(local_400,CONCAT71(uStack_3ef,local_3f0) + 1);
    }
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],CONCAT71(local_470[0]._1_7_,(undefined1)local_470[0]) + 1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,CONCAT71(local_460._17_7_,local_460[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._32_8_ != &local_430) {
      operator_delete((void *)local_460._32_8_,
                      CONCAT71(local_430._M_allocated_capacity._1_7_,local_430._M_local_buf[0]) + 1)
      ;
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSharedDestructorCode(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  auto emit_field_dtors = [&](bool split_fields) {
    // Write the destructors for each field except oneof members.
    // optimized_order_ does not contain oneof fields.
    for (const auto* field : optimized_order_) {
      if (ShouldSplit(field, options_) != split_fields) continue;
      field_generators_.get(field).GenerateDestructorCode(p);
    }
  };
  p->Emit(
      {
          {"field_dtors", [&] { emit_field_dtors(/* split_fields= */ false); }},
          {"split_field_dtors",
           [&] {
             if (!ShouldSplit(descriptor_, options_)) return;
             p->Emit(
                 {
                     {"split_field_dtors_impl",
                      [&] { emit_field_dtors(/* split_fields= */ true); }},
                 },
                 R"cc(
                   if (PROTOBUF_PREDICT_FALSE(!this_.IsSplitMessageDefault())) {
                     auto* $cached_split_ptr$ = this_.$split$;
                     $split_field_dtors_impl$;
                     delete $cached_split_ptr$;
                   }
                 )cc");
           }},
          {"oneof_field_dtors",
           [&] {
             for (const auto* oneof : OneOfRange(descriptor_)) {
               p->Emit({{"name", oneof->name()}},
                       R"cc(
                         if (this_.has_$name$()) {
                           this_.clear_$name$();
                         }
                       )cc");
             }
           }},
          {"weak_fields_dtor",
           [&] {
             if (num_weak_fields_ == 0) return;
             // Generate code to destruct oneofs. Clearing should do the work.
             p->Emit(R"cc(
               this_.$weak_field_map$.ClearAll();
             )cc");
           }},
          {"impl_dtor", [&] { p->Emit("this_._impl_.~Impl_();\n"); }},
      },
      R"cc(
        inline void $classname$::SharedDtor(MessageLite& self) {
          $classname$& this_ = static_cast<$classname$&>(self);
          this_._internal_metadata_.Delete<$unknown_fields_type$>();
          $DCHK$(this_.GetArena() == nullptr);
          $WeakDescriptorSelfPin$;
          $field_dtors$;
          $split_field_dtors$;
          $oneof_field_dtors$;
          $weak_fields_dtor$;
          $impl_dtor$;
        }
      )cc");
}